

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteServiceDocComment
               (Printer *printer,ServiceDescriptor *service)

{
  string *input;
  string local_38;
  ServiceDescriptor *local_18;
  ServiceDescriptor *service_local;
  Printer *printer_local;
  
  local_18 = service;
  service_local = (ServiceDescriptor *)printer;
  input = ServiceDescriptor::full_name_abi_cxx11_(service);
  EscapeJavadoc(&local_38,input);
  io::Printer::Print(printer,"/**\n * Protobuf service {@code $fullname$}\n","fullname",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  WriteDocCommentBody<google::protobuf::ServiceDescriptor>((Printer *)service_local,local_18);
  io::Printer::Print((Printer *)service_local," */\n");
  return;
}

Assistant:

void WriteServiceDocComment(io::Printer* printer,
                            const ServiceDescriptor* service) {
  printer->Print(
    "/**\n"
    " * Protobuf service {@code $fullname$}\n",
    "fullname", EscapeJavadoc(service->full_name()));
  WriteDocCommentBody(printer, service);
  printer->Print(" */\n");
}